

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

pair<const_void_*,_int> __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FindSymbolOnlyFlat
          (DescriptorIndex *this,string_view name)

{
  pointer pEVar1;
  string_view super_symbol;
  bool bVar2;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  _Var3;
  void *pvVar4;
  ulong uVar5;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  this_00;
  pair<const_void_*,_int> pVar6;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = name._M_str;
  local_20._M_len = name._M_len;
  _Var3 = std::
          __upper_bound<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>>,std::basic_string_view<char,std::char_traits<char>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>>
                    ((this->by_symbol_flat_).
                     super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->by_symbol_flat_).
                     super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_20,
                     (_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                      )(this->by_symbol_).
                       super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                       .
                       super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                       .tree_.rightmost_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>::checked_compare,_0UL,_false>
                       .value.
                       super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_true>
                       .super_SymbolCompare.index);
  this_00._M_current = _Var3._M_current + -1;
  if (_Var3._M_current ==
      (this->by_symbol_flat_).
      super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = _Var3;
  }
  if (this_00._M_current !=
      (this->by_symbol_flat_).
      super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    super_symbol._M_str = local_20._M_str;
    super_symbol._M_len = local_20._M_len;
    bVar2 = SymbolEntry::IsSubSymbolOf(this_00._M_current,this,super_symbol);
    if (bVar2) {
      pEVar1 = (this->all_values_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = pEVar1[(this_00._M_current)->data_offset].data;
      uVar5 = (ulong)(uint)pEVar1[(this_00._M_current)->data_offset].size;
      goto LAB_00268679;
    }
  }
  pvVar4 = (void *)0x0;
  uVar5 = 0;
LAB_00268679:
  pVar6._8_8_ = uVar5;
  pVar6.first = pvVar4;
  return pVar6;
}

Assistant:

std::pair<const void*, int>
EncodedDescriptorDatabase::DescriptorIndex::FindSymbolOnlyFlat(
    absl::string_view name) const {
  auto iter =
      FindLastLessOrEqual(&by_symbol_flat_, name, by_symbol_.key_comp());

  return iter != by_symbol_flat_.end() && iter->IsSubSymbolOf(*this, name)
             ? all_values_[iter->data_offset].value()
             : Value();
}